

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

XML_Convert_Result
utf8_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,unsigned_short *toLim)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  unsigned_short *puVar5;
  byte *pbVar6;
  XML_Convert_Result XVar7;
  
  puVar5 = *toP;
  pbVar6 = (byte *)*fromP;
  XVar7 = XML_CONVERT_OUTPUT_EXHAUSTED;
LAB_0034b7b9:
  do {
    if ((fromLim <= pbVar6) || (toLim <= puVar5)) {
      XVar7 = (uint)(pbVar6 < fromLim) * 2;
LAB_0034b8f0:
      *fromP = (char *)pbVar6;
      *toP = puVar5;
      return XVar7;
    }
    bVar1 = *pbVar6;
    uVar3 = (ushort)bVar1;
    cVar2 = *(char *)((long)enc[1].scanners + (ulong)uVar3);
    if (cVar2 != '\a') {
      if (cVar2 == '\x06') {
        if (2 < (long)fromLim - (long)pbVar6) {
          *puVar5 = pbVar6[2] & 0x3f | (pbVar6[1] & 0x3f) << 6 | uVar3 << 0xc;
          puVar5 = puVar5 + 1;
          pbVar6 = pbVar6 + 3;
          goto LAB_0034b7b9;
        }
      }
      else {
        if (cVar2 != '\x05') {
          pbVar6 = pbVar6 + 1;
          *puVar5 = (short)(char)bVar1;
          puVar5 = puVar5 + 1;
          goto LAB_0034b7b9;
        }
        if (1 < (long)fromLim - (long)pbVar6) {
          *puVar5 = pbVar6[1] & 0x3f | (uVar3 & 0x1f) << 6;
          puVar5 = puVar5 + 1;
          pbVar6 = pbVar6 + 2;
          goto LAB_0034b7b9;
        }
      }
LAB_0034b8ed:
      XVar7 = XML_CONVERT_INPUT_INCOMPLETE;
      goto LAB_0034b8f0;
    }
    if ((long)toLim - (long)puVar5 < 3) goto LAB_0034b8f0;
    if ((long)fromLim - (long)pbVar6 < 4) goto LAB_0034b8ed;
    iVar4 = (pbVar6[2] & 0x3f) * 0x40;
    bVar1 = pbVar6[3];
    *puVar5 = (ushort)(((pbVar6[1] & 0x3f) << 0xc | (uVar3 & 7) << 0x12) + iVar4 + 0xff0000 >> 10) |
              0xd800;
    puVar5[1] = bVar1 & 0x3f | (ushort)iVar4 | 0xdc00;
    puVar5 = puVar5 + 2;
    pbVar6 = pbVar6 + 4;
  } while( true );
}

Assistant:

static enum XML_Convert_Result PTRCALL
utf8_toUtf16(const ENCODING *enc,
             const char **fromP, const char *fromLim,
             unsigned short **toP, const unsigned short *toLim)
{
  enum XML_Convert_Result res = XML_CONVERT_COMPLETED;
  unsigned short *to = *toP;
  const char *from = *fromP;
  while (from < fromLim && to < toLim) {
    switch (((struct normal_encoding *)enc)->type[(unsigned char)*from]) {
    case BT_LEAD2:
      if (fromLim - from < 2) {
        res = XML_CONVERT_INPUT_INCOMPLETE;
        goto after;
      }
      *to++ = (unsigned short)(((from[0] & 0x1f) << 6) | (from[1] & 0x3f));
      from += 2;
      break;
    case BT_LEAD3:
      if (fromLim - from < 3) {
        res = XML_CONVERT_INPUT_INCOMPLETE;
        goto after;
      }
      *to++ = (unsigned short)(((from[0] & 0xf) << 12)
                               | ((from[1] & 0x3f) << 6) | (from[2] & 0x3f));
      from += 3;
      break;
    case BT_LEAD4:
      {
        unsigned long n;
        if (toLim - to < 2) {
          res = XML_CONVERT_OUTPUT_EXHAUSTED;
          goto after;
        }
        if (fromLim - from < 4) {
          res = XML_CONVERT_INPUT_INCOMPLETE;
          goto after;
        }
        n = ((from[0] & 0x7) << 18) | ((from[1] & 0x3f) << 12)
            | ((from[2] & 0x3f) << 6) | (from[3] & 0x3f);
        n -= 0x10000;
        to[0] = (unsigned short)((n >> 10) | 0xD800);
        to[1] = (unsigned short)((n & 0x3FF) | 0xDC00);
        to += 2;
        from += 4;
      }
      break;
    default:
      *to++ = *from++;
      break;
    }
  }
  if (from < fromLim)
    res = XML_CONVERT_OUTPUT_EXHAUSTED;
after:
  *fromP = from;
  *toP = to;
  return res;
}